

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test
          (ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,string *tested_declaration,string *tested_snippet)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *pTVar4;
  undefined4 local_120;
  undefined4 local_11c;
  GLuint vao_id;
  GLuint texture_object_id;
  GLuint framebuffer_object_id;
  uchar buffer [4];
  string *vertex_shader_source;
  string **local_c8;
  string *tess_eval_shader_source;
  string **local_a0;
  string *tess_ctrl_shader_source;
  string local_88;
  string *local_68;
  string *geometry_shader_source;
  string *local_40;
  string *fragment_shader_source;
  string *compute_shader_source;
  Functions *gl;
  string *tested_snippet_local;
  string *tested_declaration_local;
  ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL> *pEStack_10;
  TestShaderType tested_shader_type_local;
  ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  gl = (Functions *)tested_snippet;
  tested_snippet_local = tested_declaration;
  tested_declaration_local._4_4_ = tested_shader_type;
  pEStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  compute_shader_source = (string *)CONCAT44(extraout_var,iVar1);
  fragment_shader_source = (string *)empty_string_abi_cxx11_;
  prepare_fragment_shader
            ((string *)&geometry_shader_source,this,tested_declaration_local._4_4_,
             tested_snippet_local,(string *)gl);
  local_40 = (string *)&geometry_shader_source;
  prepare_geometry_shader
            (&local_88,this,tested_declaration_local._4_4_,tested_snippet_local,(string *)gl);
  local_68 = &local_88;
  prepare_tess_ctrl_shader
            ((string *)&tess_eval_shader_source,this,tested_declaration_local._4_4_,
             tested_snippet_local,(string *)gl);
  local_a0 = &tess_eval_shader_source;
  prepare_tess_eval_shader
            ((string *)&vertex_shader_source,this,tested_declaration_local._4_4_,
             tested_snippet_local,(string *)gl);
  local_c8 = &vertex_shader_source;
  prepare_vertex_shader
            ((string *)&framebuffer_object_id,this,tested_declaration_local._4_4_,
             tested_snippet_local,(string *)gl);
  if (tested_declaration_local._4_4_ < COMPUTE_SHADER_TYPE) {
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[9])(this,&framebuffer_object_id,local_40,0);
  }
  else {
    if (3 < tested_declaration_local._4_4_ - COMPUTE_SHADER_TYPE) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xec3);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])
              (this,&framebuffer_object_id,local_a0,local_c8,local_68,local_40,
               empty_string_abi_cxx11_,0,0);
  }
  std::__cxx11::string::~string((string *)&framebuffer_object_id);
  std::__cxx11::string::~string((string *)&vertex_shader_source);
  std::__cxx11::string::~string((string *)&tess_eval_shader_source);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&geometry_shader_source);
  texture_object_id = 0;
  vao_id = 0;
  local_11c = 0;
  local_120 = 0;
  (**(code **)(compute_shader_source + 0xb4))
            ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glUseProgram() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xed8);
  (**(code **)((long)&compute_shader_source[0x37].field_2 + 8))(1,&local_11c);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glGenTextures() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xedb);
  (**(code **)((long)&compute_shader_source[5].field_2 + 8))(0xde1,local_11c);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glBindTexture() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xede);
  (**(code **)(compute_shader_source + 0x9c))(0xde1,1,0x8058,1);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glTexStorage2D() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xee1);
  (*(code *)compute_shader_source[0x36].field_2._M_allocated_capacity)(1,&vao_id);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glGenFramebuffers() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xee4);
  (**(code **)((long)&compute_shader_source[3].field_2 + 8))(0x8d40,vao_id);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glBindFramebuffer() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xee7);
  (**(code **)(compute_shader_source + 0x35))(0x8d40,0x8ce0,0xde1,local_11c);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glFramebufferTexture2D() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xeea);
  (**(code **)(compute_shader_source + 0xd0))(0,0,1);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glViewport() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xeed);
  (*(code *)compute_shader_source[0x38]._M_string_length)(1,&local_120);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glGenVertexArrays() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xef0);
  (**(code **)((long)&compute_shader_source[6].field_2 + 8))(local_120);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glBindVertexArray() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xef3);
  if (tested_declaration_local._4_4_ < COMPUTE_SHADER_TYPE) {
    (**(code **)((long)&compute_shader_source[0x29].field_2 + 8))(6,0,4);
    dVar2 = (**(code **)(compute_shader_source + 0x40))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0xefa);
  }
  else if (tested_declaration_local._4_4_ == GEOMETRY_SHADER_TYPE) {
    (**(code **)((long)&compute_shader_source[0x29].field_2 + 8))(0,0,1);
    dVar2 = (**(code **)(compute_shader_source + 0x40))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0xf09);
  }
  else {
    if (1 < tested_declaration_local._4_4_ - TESSELATION_CONTROL_SHADER_TYPE) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xf0d);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)((long)&compute_shader_source[0x7e].field_2 + 8))(0x8e72,1);
    dVar2 = (**(code **)(compute_shader_source + 0x40))();
    glu::checkError(dVar2,"PatchParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0xf01);
    (**(code **)((long)&compute_shader_source[0x29].field_2 + 8))(0xe,0,1);
    dVar2 = (**(code **)(compute_shader_source + 0x40))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0xf04);
  }
  (**(code **)((long)&compute_shader_source[0x90].field_2 + 8))(0x8ce0);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glReadBuffer() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xf12);
  (**(code **)(compute_shader_source + 0x91))(0,0,1,1,0x1908,0x1401,&texture_object_id);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"glReadPixels() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xf15);
  if ((char)texture_object_id != -1) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid array size was returned.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xf19);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(compute_shader_source + 0x24))(1,&local_11c);
  (**(code **)(compute_shader_source + 0x22))(1,&vao_id);
  (*(code *)compute_shader_source[0x24].field_2._M_allocated_capacity)(1,&local_120);
  dVar2 = (**(code **)(compute_shader_source + 0x40))();
  glu::checkError(dVar2,"An error ocurred while deleting generated objects.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0xf20);
  return;
}

Assistant:

void ExpressionsLength1<API>::execute_draw_test(typename TestCaseBase<API>::TestShaderType tested_shader_type,
												const std::string&						   tested_declaration,
												const std::string&						   tested_snippet)
{
	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	if (API::USE_ALL_SHADER_STAGES)
	{
		const std::string& compute_shader_source = empty_string;
		const std::string& fragment_shader_source =
			this->prepare_fragment_shader(tested_shader_type, tested_declaration, tested_snippet);
		const std::string& geometry_shader_source =
			this->prepare_geometry_shader(tested_shader_type, tested_declaration, tested_snippet);
		const std::string& tess_ctrl_shader_source =
			this->prepare_tess_ctrl_shader(tested_shader_type, tested_declaration, tested_snippet);
		const std::string& tess_eval_shader_source =
			this->prepare_tess_eval_shader(tested_shader_type, tested_declaration, tested_snippet);
		const std::string& vertex_shader_source =
			this->prepare_vertex_shader(tested_shader_type, tested_declaration, tested_snippet);

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
			break;

		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			this->execute_positive_test(vertex_shader_source, tess_ctrl_shader_source, tess_eval_shader_source,
										geometry_shader_source, fragment_shader_source, compute_shader_source, false,
										false);
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}
	else
	{
		const std::string& fragment_shader_source =
			this->prepare_fragment_shader(tested_shader_type, tested_declaration, tested_snippet);
		const std::string& vertex_shader_source =
			this->prepare_vertex_shader(tested_shader_type, tested_declaration, tested_snippet);

		this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
	}

	/* We are now ready to verify whether the returned size is correct. */
	unsigned char buffer[4]				= { 0 };
	glw::GLuint   framebuffer_object_id = 0;
	glw::GLuint   texture_object_id		= 0;
	glw::GLuint   vao_id				= 0;

	gl.useProgram(this->program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

	gl.genTextures(1, &texture_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed.");

	gl.bindTexture(GL_TEXTURE_2D, texture_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() failed.");

	gl.genFramebuffers(1, &framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() failed.");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture_object_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() failed.");

	gl.viewport(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() failed.");

	gl.genVertexArrays(1, &vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() failed.");

	gl.bindVertexArray(vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() failed.");

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE: /* Fall through */
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		gl.drawArrays(GL_TRIANGLE_FAN, 0, 4);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		/* Tesselation patch set up */
		gl.patchParameteri(GL_PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

		gl.drawArrays(GL_PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		gl.drawArrays(GL_POINTS, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer() failed.");

	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed.");

	if (buffer[0] != 255)
	{
		TCU_FAIL("Invalid array size was returned.");
	}

	/* Delete generated objects. */
	gl.deleteTextures(1, &texture_object_id);
	gl.deleteFramebuffers(1, &framebuffer_object_id);
	gl.deleteVertexArrays(1, &vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "An error ocurred while deleting generated objects.");
}